

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1651::run(TestCase1651 *this)

{
  ArrayPtr<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader>
  lists_00;
  bool bVar1;
  uint uVar2;
  int64_t iVar3;
  Orphanage OVar4;
  ArrayPtr<const_char> AVar5;
  Reader local_d48;
  ArrayPtr<const_char> local_d18;
  bool local_d01;
  undefined1 local_d00 [7];
  bool _kj_shouldLog_15;
  ArrayPtr<const_char> local_cd0;
  Reader local_cc0;
  int64_t local_c90;
  int local_c88;
  bool local_c81;
  undefined1 local_c80 [7];
  bool _kj_shouldLog_14;
  Reader local_c50;
  ArrayPtr<const_char> local_c20;
  bool local_c09;
  undefined1 local_c08 [7];
  bool _kj_shouldLog_13;
  ArrayPtr<const_char> local_bd8;
  Reader local_bc8;
  int64_t local_b98;
  int local_b90;
  bool local_b89;
  undefined1 local_b88 [7];
  bool _kj_shouldLog_12;
  Reader local_b58;
  ArrayPtr<const_char> local_b28;
  bool local_b11;
  undefined1 local_b10 [7];
  bool _kj_shouldLog_11;
  ArrayPtr<const_char> local_ae0;
  Reader local_ad0;
  int64_t local_aa0;
  int local_a98;
  bool local_a91;
  undefined1 local_a90 [7];
  bool _kj_shouldLog_10;
  Reader local_a60;
  ArrayPtr<const_char> local_a30;
  bool local_a19;
  undefined1 local_a18 [7];
  bool _kj_shouldLog_9;
  ArrayPtr<const_char> local_9e8;
  Reader local_9d8;
  int64_t local_9a8;
  int local_9a0;
  bool local_999;
  undefined1 local_998 [7];
  bool _kj_shouldLog_8;
  bool local_961;
  undefined1 local_960 [7];
  bool _kj_shouldLog_7;
  Reader local_930;
  int64_t local_900;
  int local_8f8;
  bool local_8f1;
  undefined1 local_8f0 [7];
  bool _kj_shouldLog_6;
  Reader local_8c0;
  ArrayPtr<const_char> local_890;
  bool local_879;
  undefined1 local_878 [7];
  bool _kj_shouldLog_5;
  ArrayPtr<const_char> local_848;
  Reader local_838;
  int64_t local_808;
  int local_800;
  bool local_7f9;
  undefined1 local_7f8 [7];
  bool _kj_shouldLog_4;
  bool local_7c1;
  undefined1 local_7c0 [7];
  bool _kj_shouldLog_3;
  Reader local_790;
  int64_t local_760;
  int local_758;
  bool local_751;
  undefined1 local_750 [7];
  bool _kj_shouldLog_2;
  Reader local_720;
  ArrayPtr<const_char> local_6f0;
  bool local_6d9;
  undefined1 local_6d8 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_6a8;
  Reader local_698;
  int64_t local_668;
  int local_660;
  bool local_659;
  undefined1 local_658 [7];
  bool _kj_shouldLog;
  uint local_628 [2];
  Fault local_620;
  Fault f;
  Reader local_5e8;
  undefined1 local_5c8 [8];
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestNewVersion>_> cat;
  Orphanage local_588;
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> local_578;
  BuilderFor<capnproto_test::capnp::test::TestAnyPointer> local_558;
  Builder local_530;
  undefined1 local_518 [8];
  Orphan<capnproto_test::capnp::test::TestAnyPointer> orphan3;
  ArrayPtr<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader> array;
  Reader local_4b8;
  undefined1 local_498 [8];
  Reader lists [2];
  ArrayPtr<const_char> local_430;
  Builder local_420;
  Builder local_3f8;
  ArrayPtr<const_char> local_3d0;
  Builder local_3c0;
  Builder local_398;
  ArrayPtr<const_char> local_370;
  Builder local_360;
  Builder local_338;
  ArrayPtr<const_char> local_310;
  Builder local_300;
  Builder local_2d8;
  BuilderFor<capnproto_test::capnp::test::TestAnyPointer> local_2b0;
  Builder local_288;
  undefined1 local_270 [8];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestNewVersion>_> list2;
  Orphan<capnproto_test::capnp::test::TestAnyPointer> orphan2;
  Builder local_218;
  Builder local_1f0;
  ArrayPtr<const_char> local_1c8;
  Builder local_1b8;
  Builder local_190;
  undefined1 local_168 [8];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> list1;
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> orphan1;
  undefined1 local_110 [8];
  Orphanage orphanage;
  MallocMessageBuilder message;
  TestCase1651 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&orphanage.capTable,0x400,GROW_HEURISTICALLY);
  OVar4 = MessageBuilder::getOrphanage((MessageBuilder *)&orphanage.capTable);
  orphanage.arena = (BuilderArena *)OVar4.capTable;
  local_110 = (undefined1  [8])OVar4.arena;
  Orphanage::newOrphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            ((Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)
             &list1.builder.structDataSize,(Orphanage *)local_110,2);
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_>::get
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> *)local_168,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)
             &list1.builder.structDataSize);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_190,(Builder *)local_168,0);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1(&local_190,0xc);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_1b8,(Builder *)local_168,0);
  Text::Reader::Reader((Reader *)&local_1c8,"foo");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&local_1b8,(Reader)local_1c8);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_1f0,(Builder *)local_168,1);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1(&local_1f0,0x22);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_218,(Builder *)local_168,1);
  Text::Reader::Reader((Reader *)&orphan2.builder.location,"bar");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2
            (&local_218,(Reader)stack0xfffffffffffffdd8);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAnyPointer>
            ((Orphan<capnproto_test::capnp::test::TestAnyPointer> *)&list2.builder.structDataSize,
             (Orphanage *)local_110);
  Orphan<capnproto_test::capnp::test::TestAnyPointer>::get
            (&local_2b0,
             (Orphan<capnproto_test::capnp::test::TestAnyPointer> *)&list2.builder.structDataSize);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField(&local_288,&local_2b0);
  AnyPointer::Builder::
  initAs<capnp::List<capnproto_test::capnp::test::TestNewVersion,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestNewVersion>_> *)local_270,
             &local_288,2);
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_2d8,(Builder *)local_270,0);
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld1(&local_2d8,0x38);
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_300,(Builder *)local_270,0);
  Text::Reader::Reader((Reader *)&local_310,"baz");
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld2(&local_300,(Reader)local_310);
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_338,(Builder *)local_270,0);
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew1(&local_338,0x7b);
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_360,(Builder *)local_270,0);
  Text::Reader::Reader((Reader *)&local_370,"corge");
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew2(&local_360,(Reader)local_370);
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_398,(Builder *)local_270,1);
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld1(&local_398,0x4e);
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_3c0,(Builder *)local_270,1);
  Text::Reader::Reader((Reader *)&local_3d0,"qux");
  capnproto_test::capnp::test::TestNewVersion::Builder::setOld2(&local_3c0,(Reader)local_3d0);
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_3f8,(Builder *)local_270,1);
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew1(&local_3f8,0x1c8);
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_420,(Builder *)local_270,1);
  Text::Reader::Reader((Reader *)&local_430,"grault");
  capnproto_test::capnp::test::TestNewVersion::Builder::setNew2(&local_420,(Reader)local_430);
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_>::getReader
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> *)local_498,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)
             &list1.builder.structDataSize);
  Orphan<capnproto_test::capnp::test::TestAnyPointer>::getReader
            ((ReaderFor<capnproto_test::capnp::test::TestAnyPointer> *)&array.size_,
             (Orphan<capnproto_test::capnp::test::TestAnyPointer> *)&list2.builder.structDataSize);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            (&local_4b8,(Reader *)&array.size_);
  AnyPointer::Reader::getAs<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> *)
             &lists[0].reader.nestingLimit,&local_4b8);
  kj::ArrayPtr<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>::Reader>::
  ArrayPtr<2ul>((ArrayPtr<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>::Reader>
                 *)&orphan3.builder.location,(Reader (*) [2])local_498);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAnyPointer>
            ((Orphan<capnproto_test::capnp::test::TestAnyPointer> *)local_518,(Orphanage *)local_110
            );
  Orphan<capnproto_test::capnp::test::TestAnyPointer>::get
            (&local_558,(Orphan<capnproto_test::capnp::test::TestAnyPointer> *)local_518);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField(&local_530,&local_558);
  local_588 = MessageBuilder::getOrphanage((MessageBuilder *)&orphanage.capTable);
  cat.reader._40_8_ = orphan3.builder.location;
  lists_00.size_ = (size_t)array.ptr;
  lists_00.ptr = (Reader *)orphan3.builder.location;
  Orphanage::
  newOrphanConcat<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader>
            (&local_578,&local_588,lists_00);
  AnyPointer::Builder::
  adopt<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            (&local_530,&local_578);
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_>::~Orphan
            (&local_578);
  Orphan<capnproto_test::capnp::test::TestAnyPointer>::getReader
            ((ReaderFor<capnproto_test::capnp::test::TestAnyPointer> *)&f,
             (Orphan<capnproto_test::capnp::test::TestAnyPointer> *)local_518);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_5e8,(Reader *)&f);
  AnyPointer::Reader::getAs<capnp::List<capnproto_test::capnp::test::TestNewVersion,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestNewVersion>_> *)local_5c8,
             &local_5e8);
  uVar2 = List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::size
                    ((Reader *)local_5c8);
  if (uVar2 != 4) {
    local_628[1] = 4;
    local_628[0] = List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::size
                             ((Reader *)local_5c8);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_int>
              (&local_620,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x697,FAILED,"(4) == (cat.size())","4, cat.size()",(int *)(local_628 + 1),local_628)
    ;
    kj::_::Debug::Fault::fatal(&local_620);
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_658,(Reader *)local_5c8,0);
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Reader::getOld1((Reader *)local_658);
  if (iVar3 != 0xc) {
    local_659 = kj::_::Debug::shouldLog(ERROR);
    while (local_659 != false) {
      local_660 = 0xc;
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_698,(Reader *)local_5c8,0);
      local_668 = capnproto_test::capnp::test::TestNewVersion::Reader::getOld1(&local_698);
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x699,ERROR,
                 "\"failed: expected \" \"(12) == (cat[0].getOld1())\", 12, cat[0].getOld1()",
                 (char (*) [44])"failed: expected (12) == (cat[0].getOld1())",&local_660,&local_668)
      ;
      local_659 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_6d8,(Reader *)local_5c8,0);
  local_6a8 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)local_6d8);
  bVar1 = kj::operator==("foo",(StringPtr *)&local_6a8);
  if (!bVar1) {
    local_6d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6d9 != false) {
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_720,(Reader *)local_5c8,0);
      AVar5 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getOld2(&local_720);
      local_6f0 = AVar5;
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69a,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (cat[0].getOld2())\", \"foo\", cat[0].getOld2()"
                 ,(char (*) [47])"failed: expected (\"foo\") == (cat[0].getOld2())",
                 (char (*) [4])"foo",(Reader *)&local_6f0);
      local_6d9 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_750,(Reader *)local_5c8,0);
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Reader::getNew1((Reader *)local_750);
  if (iVar3 != 0x3db) {
    local_751 = kj::_::Debug::shouldLog(ERROR);
    while (local_751 != false) {
      local_758 = 0x3db;
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_790,(Reader *)local_5c8,0);
      local_760 = capnproto_test::capnp::test::TestNewVersion::Reader::getNew1(&local_790);
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69b,ERROR,
                 "\"failed: expected \" \"(987) == (cat[0].getNew1())\", 987, cat[0].getNew1()",
                 (char (*) [45])"failed: expected (987) == (cat[0].getNew1())",&local_758,&local_760
                );
      local_751 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_7c0,(Reader *)local_5c8,0);
  bVar1 = capnproto_test::capnp::test::TestNewVersion::Reader::hasNew2((Reader *)local_7c0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_7c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_7c1 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69c,ERROR,"\"failed: expected \" \"!(cat[0].hasNew2())\"",
                 (char (*) [37])"failed: expected !(cat[0].hasNew2())");
      local_7c1 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_7f8,(Reader *)local_5c8,1);
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Reader::getOld1((Reader *)local_7f8);
  if (iVar3 != 0x22) {
    local_7f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_7f9 != false) {
      local_800 = 0x22;
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_838,(Reader *)local_5c8,1);
      local_808 = capnproto_test::capnp::test::TestNewVersion::Reader::getOld1(&local_838);
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69e,ERROR,
                 "\"failed: expected \" \"(34) == (cat[1].getOld1())\", 34, cat[1].getOld1()",
                 (char (*) [44])"failed: expected (34) == (cat[1].getOld1())",&local_800,&local_808)
      ;
      local_7f9 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_878,(Reader *)local_5c8,1);
  local_848 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)local_878);
  bVar1 = kj::operator==("bar",(StringPtr *)&local_848);
  if (!bVar1) {
    local_879 = kj::_::Debug::shouldLog(ERROR);
    while (local_879 != false) {
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_8c0,(Reader *)local_5c8,1);
      AVar5 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getOld2(&local_8c0);
      local_890 = AVar5;
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x69f,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (cat[1].getOld2())\", \"bar\", cat[1].getOld2()"
                 ,(char (*) [47])"failed: expected (\"bar\") == (cat[1].getOld2())",
                 (char (*) [4])0x4b5bf5,(Reader *)&local_890);
      local_879 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_8f0,(Reader *)local_5c8,1);
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Reader::getNew1((Reader *)local_8f0);
  if (iVar3 != 0x3db) {
    local_8f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8f1 != false) {
      local_8f8 = 0x3db;
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_930,(Reader *)local_5c8,1);
      local_900 = capnproto_test::capnp::test::TestNewVersion::Reader::getNew1(&local_930);
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a0,ERROR,
                 "\"failed: expected \" \"(987) == (cat[1].getNew1())\", 987, cat[1].getNew1()",
                 (char (*) [45])"failed: expected (987) == (cat[1].getNew1())",&local_8f8,&local_900
                );
      local_8f1 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_960,(Reader *)local_5c8,1);
  bVar1 = capnproto_test::capnp::test::TestNewVersion::Reader::hasNew2((Reader *)local_960);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_961 = kj::_::Debug::shouldLog(ERROR);
    while (local_961 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a1,ERROR,"\"failed: expected \" \"!(cat[1].hasNew2())\"",
                 (char (*) [37])"failed: expected !(cat[1].hasNew2())");
      local_961 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_998,(Reader *)local_5c8,2);
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Reader::getOld1((Reader *)local_998);
  if (iVar3 != 0x38) {
    local_999 = kj::_::Debug::shouldLog(ERROR);
    while (local_999 != false) {
      local_9a0 = 0x38;
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_9d8,(Reader *)local_5c8,2);
      local_9a8 = capnproto_test::capnp::test::TestNewVersion::Reader::getOld1(&local_9d8);
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a3,ERROR,
                 "\"failed: expected \" \"(56) == (cat[2].getOld1())\", 56, cat[2].getOld1()",
                 (char (*) [44])"failed: expected (56) == (cat[2].getOld1())",&local_9a0,&local_9a8)
      ;
      local_999 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_a18,(Reader *)local_5c8,2);
  local_9e8 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)local_a18);
  bVar1 = kj::operator==("baz",(StringPtr *)&local_9e8);
  if (!bVar1) {
    local_a19 = kj::_::Debug::shouldLog(ERROR);
    while (local_a19 != false) {
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_a60,(Reader *)local_5c8,2);
      AVar5 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getOld2(&local_a60);
      local_a30 = AVar5;
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a4,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (cat[2].getOld2())\", \"baz\", cat[2].getOld2()"
                 ,(char (*) [47])"failed: expected (\"baz\") == (cat[2].getOld2())",
                 (char (*) [4])0x4bdece,(Reader *)&local_a30);
      local_a19 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_a90,(Reader *)local_5c8,2);
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Reader::getNew1((Reader *)local_a90);
  if (iVar3 != 0x7b) {
    local_a91 = kj::_::Debug::shouldLog(ERROR);
    while (local_a91 != false) {
      local_a98 = 0x7b;
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_ad0,(Reader *)local_5c8,2);
      local_aa0 = capnproto_test::capnp::test::TestNewVersion::Reader::getNew1(&local_ad0);
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a5,ERROR,
                 "\"failed: expected \" \"(123) == (cat[2].getNew1())\", 123, cat[2].getNew1()",
                 (char (*) [45])"failed: expected (123) == (cat[2].getNew1())",&local_a98,&local_aa0
                );
      local_a91 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_b10,(Reader *)local_5c8,2);
  local_ae0 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getNew2((Reader *)local_b10);
  bVar1 = kj::operator==("corge",(StringPtr *)&local_ae0);
  if (!bVar1) {
    local_b11 = kj::_::Debug::shouldLog(ERROR);
    while (local_b11 != false) {
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_b58,(Reader *)local_5c8,2);
      AVar5 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getNew2(&local_b58);
      local_b28 = AVar5;
      kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a6,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (cat[2].getNew2())\", \"corge\", cat[2].getNew2()"
                 ,(char (*) [49])"failed: expected (\"corge\") == (cat[2].getNew2())",
                 (char (*) [6])"corge",(Reader *)&local_b28);
      local_b11 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_b88,(Reader *)local_5c8,3);
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Reader::getOld1((Reader *)local_b88);
  if (iVar3 != 0x4e) {
    local_b89 = kj::_::Debug::shouldLog(ERROR);
    while (local_b89 != false) {
      local_b90 = 0x4e;
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_bc8,(Reader *)local_5c8,3);
      local_b98 = capnproto_test::capnp::test::TestNewVersion::Reader::getOld1(&local_bc8);
      kj::_::Debug::log<char_const(&)[44],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a8,ERROR,
                 "\"failed: expected \" \"(78) == (cat[3].getOld1())\", 78, cat[3].getOld1()",
                 (char (*) [44])"failed: expected (78) == (cat[3].getOld1())",&local_b90,&local_b98)
      ;
      local_b89 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_c08,(Reader *)local_5c8,3);
  local_bd8 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getOld2((Reader *)local_c08);
  bVar1 = kj::operator==("qux",(StringPtr *)&local_bd8);
  if (!bVar1) {
    local_c09 = kj::_::Debug::shouldLog(ERROR);
    while (local_c09 != false) {
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_c50,(Reader *)local_5c8,3);
      AVar5 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getOld2(&local_c50);
      local_c20 = AVar5;
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6a9,ERROR,
                 "\"failed: expected \" \"(\\\"qux\\\") == (cat[3].getOld2())\", \"qux\", cat[3].getOld2()"
                 ,(char (*) [47])"failed: expected (\"qux\") == (cat[3].getOld2())",
                 (char (*) [4])0x4c3ec5,(Reader *)&local_c20);
      local_c09 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_c80,(Reader *)local_5c8,3);
  iVar3 = capnproto_test::capnp::test::TestNewVersion::Reader::getNew1((Reader *)local_c80);
  if (iVar3 != 0x1c8) {
    local_c81 = kj::_::Debug::shouldLog(ERROR);
    while (local_c81 != false) {
      local_c88 = 0x1c8;
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_cc0,(Reader *)local_5c8,3);
      local_c90 = capnproto_test::capnp::test::TestNewVersion::Reader::getNew1(&local_cc0);
      kj::_::Debug::log<char_const(&)[45],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6aa,ERROR,
                 "\"failed: expected \" \"(456) == (cat[3].getNew1())\", 456, cat[3].getNew1()",
                 (char (*) [45])"failed: expected (456) == (cat[3].getNew1())",&local_c88,&local_c90
                );
      local_c81 = false;
    }
  }
  List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_d00,(Reader *)local_5c8,3);
  local_cd0 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getNew2((Reader *)local_d00);
  bVar1 = kj::operator==("grault",(StringPtr *)&local_cd0);
  if (!bVar1) {
    local_d01 = kj::_::Debug::shouldLog(ERROR);
    while (local_d01 != false) {
      List<capnproto_test::capnp::test::TestNewVersion,_(capnp::Kind)3>::Reader::operator[]
                (&local_d48,(Reader *)local_5c8,3);
      AVar5 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestNewVersion::Reader::getNew2(&local_d48);
      local_d18 = AVar5;
      kj::_::Debug::log<char_const(&)[50],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x6ab,ERROR,
                 "\"failed: expected \" \"(\\\"grault\\\") == (cat[3].getNew2())\", \"grault\", cat[3].getNew2()"
                 ,(char (*) [50])"failed: expected (\"grault\") == (cat[3].getNew2())",
                 (char (*) [7])"grault",(Reader *)&local_d18);
      local_d01 = false;
    }
  }
  Orphan<capnproto_test::capnp::test::TestAnyPointer>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAnyPointer> *)local_518);
  Orphan<capnproto_test::capnp::test::TestAnyPointer>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAnyPointer> *)&list2.builder.structDataSize);
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_>::~Orphan
            ((Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)
             &list1.builder.structDataSize);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphanage.capTable);
  return;
}

Assistant:

TEST(Orphans, ConcatenateStructLists) {
  // In this test, we not only concatenate two struct lists, but we concatenate in a list that
  // contains a newer-than-expected version of the struct with extra fields, in order to verify
  // that the new fields aren't lost.

  MallocMessageBuilder message;
  auto orphanage = message.getOrphanage();

  auto orphan1 = orphanage.newOrphan<List<test::TestOldVersion>>(2);
  auto list1 = orphan1.get();
  list1[0].setOld1(12);
  list1[0].setOld2("foo");
  list1[1].setOld1(34);
  list1[1].setOld2("bar");

  auto orphan2 = orphanage.newOrphan<test::TestAnyPointer>();
  auto list2 = orphan2.get().getAnyPointerField().initAs<List<test::TestNewVersion>>(2);
  list2[0].setOld1(56);
  list2[0].setOld2("baz");
  list2[0].setNew1(123);
  list2[0].setNew2("corge");
  list2[1].setOld1(78);
  list2[1].setOld2("qux");
  list2[1].setNew1(456);
  list2[1].setNew2("grault");

  List<test::TestOldVersion>::Reader lists[] = {
    orphan1.getReader(),
    orphan2.getReader().getAnyPointerField().getAs<List<test::TestOldVersion>>()
  };
  kj::ArrayPtr<List<test::TestOldVersion>::Reader> array = lists;

  auto orphan3 = orphanage.newOrphan<test::TestAnyPointer>();
  orphan3.get().getAnyPointerField().adopt(message.getOrphanage().newOrphanConcat(array));

  auto cat = orphan3.getReader().getAnyPointerField().getAs<List<test::TestNewVersion>>();
  ASSERT_EQ(4, cat.size());

  EXPECT_EQ(12, cat[0].getOld1());
  EXPECT_EQ("foo", cat[0].getOld2());
  EXPECT_EQ(987, cat[0].getNew1());
  EXPECT_FALSE(cat[0].hasNew2());

  EXPECT_EQ(34, cat[1].getOld1());
  EXPECT_EQ("bar", cat[1].getOld2());
  EXPECT_EQ(987, cat[1].getNew1());
  EXPECT_FALSE(cat[1].hasNew2());

  EXPECT_EQ(56, cat[2].getOld1());
  EXPECT_EQ("baz", cat[2].getOld2());
  EXPECT_EQ(123, cat[2].getNew1());
  EXPECT_EQ("corge", cat[2].getNew2());

  EXPECT_EQ(78, cat[3].getOld1());
  EXPECT_EQ("qux", cat[3].getOld2());
  EXPECT_EQ(456, cat[3].getNew1());
  EXPECT_EQ("grault", cat[3].getNew2());
}